

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O1

region_ptr __thiscall
cornelich::vanilla_index::index_for
          (vanilla_index *this,int32_t cycle,int32_t file_number,bool append)

{
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *phVar1;
  long lVar2;
  string *base_path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  iterator iVar4;
  undefined7 in_register_00000009;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_00;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_01;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_03;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_04;
  spin_lock *psVar6;
  undefined4 in_register_00000034;
  undefined8 *puVar7;
  final_node_type *x;
  bool in_R8B;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_bool>
  pVar8;
  region_ptr rVar9;
  __tuple_element_t<1UL,_tuple<int,_int>_> file_number_;
  shared_ptr<cornelich::region> v;
  _Head_base<1UL,_int,_false> local_23c;
  region *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  spin_lock *local_228;
  _Head_base<1UL,_int,_false> local_220;
  _Head_base<0UL,_int,_false> _Stack_21c;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  ios_base local_138 [264];
  
  puVar7 = (undefined8 *)CONCAT44(in_register_00000034,cycle);
  local_228 = (spin_lock *)((long)puVar7 + 0xc);
  util::spin_lock::lock<cornelich::util::default_backoff<5ul>>(local_228,(default_backoff<5UL>)0x1);
  local_220._M_head_impl = (int)CONCAT71(in_register_00000009,append);
  _Stack_21c._M_head_impl = file_number;
  iVar4 = boost::multi_index::detail::
          hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
          ::
          find<std::tuple<int,int>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>>
                    ((hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)(puVar7 + 6),&local_220,(long)puVar7 + 0x31,(long)puVar7 + 0x32);
  phVar1 = (hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
            *)puVar7[5];
  if (iVar4.node == phVar1) {
    local_23c._M_head_impl = local_220._M_head_impl;
    base_path = (string *)*puVar7;
    cycle_formatter::date_from_cycle_abi_cxx11_
              (&local_218,(cycle_formatter *)base_path[1]._M_string_length,
               (long)_Stack_21c._M_head_impl);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,INDEX_FILE_NAME_PREFIX_abi_cxx11_,DAT_0011f378);
    std::ostream::operator<<((ostream *)&local_1a8,local_23c._M_head_impl);
    std::__cxx11::stringbuf::str();
    make_file(&local_1f8,base_path,&local_218,&local_1d8,in_R8B);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    if (local_1f8._M_string_length == 0) {
      local_238 = (region *)0x0;
      _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_1b8._0_8_ = 1L << (*(byte *)(puVar7 + 1) & 0x3f);
      local_238 = (region *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cornelich::region,std::allocator<cornelich::region>,std::__cxx11::string&,long_long,int&>
                (&_Stack_230,&local_238,(allocator<cornelich::region> *)&local_218,&local_1f8,
                 (longlong *)local_1b8,&local_23c._M_head_impl);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    }
    _Var3._M_pi = _Stack_230._M_pi;
    if (local_238 == (region *)0x0) {
      this->m_settings = (vanilla_chronicle_settings *)0x0;
      this->m_index_block_size_bits = 0;
      this->m_lock = (atomic_flag)0x0;
      *(undefined3 *)&this->field_0xd = 0;
      _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->m_index_block_size_bits = _Var3._M_pi
      ;
      local_238 = (region *)0x0;
    }
    else {
      if ((ulong)puVar7[2] <= (ulong)puVar7[0xd]) {
        x = (final_node_type *)(*(long *)(puVar7[5] + 0x30) + -0x28);
        if (*(long *)(puVar7[5] + 0x30) == 0) {
          x = (final_node_type *)0x0;
        }
        boost::multi_index::
        multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
        ::erase_((multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                  *)(puVar7 + 4),x);
      }
      local_1b8._4_4_ = _Stack_21c._M_head_impl;
      local_1b8._0_4_ =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)local_220._M_head_impl;
      local_1b8._8_8_ = local_238;
      local_1a8._M_pi = _Stack_230._M_pi;
      if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_230._M_pi)->_M_use_count = (_Stack_230._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_230._M_pi)->_M_use_count = (_Stack_230._M_pi)->_M_use_count + 1;
        }
      }
      pVar8 = boost::multi_index::detail::
              sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
              ::insert((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                        *)(puVar7 + 6),
                       (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
                        *)puVar7[5],(value_type *)local_1b8);
      _Var5._M_pi = pVar8._8_8_;
      if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      }
      this->m_settings =
           *(vanilla_chronicle_settings **)
            ((long)&((pVar8.first.node.node)->
                    super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                    ).
                    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                    .
                    super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                    .space.data_ + 8);
      lVar2 = *(long *)((long)&((pVar8.first.node.node)->
                               super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                               ).
                               super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                               .
                               super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                               .space.data_ + 0x10);
      this->m_index_block_size_bits = (int)lVar2;
      this->m_lock = (mutex_t)(char)((ulong)lVar2 >> 0x20);
      *(int3 *)&this->field_0xd = (int3)((ulong)lVar2 >> 0x28);
      if (lVar2 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        }
      }
    }
    psVar6 = local_228;
    if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
    }
  }
  else {
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(phVar1 + 1);
    *(undefined8 *)
     ((long)iVar4.node[1].
            super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
            .
            super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
            .space.data_.align_ + 8) =
         *(undefined8 *)
          ((long)&iVar4.node[1].
                  super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                  .
                  super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                  .space.data_ + 8);
    **(type **)((long)&iVar4.node[1].
                       super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                       .
                       super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                       .space.data_ + 8) =
         iVar4.node[1].
         super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
         .
         super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
         .space.data_.align_;
    iVar4.node[1].
    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
    .super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>.
    space.data_.align_ =
         phVar1[1].
         super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
         .
         super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
         .space.data_.align_;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&iVar4.node[1].
             super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
             .
             super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
             .space.data_ + 8) = _Var5._M_pi;
    phVar1[1].
    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
    .super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>.
    space.data_.align_ = (type)(iVar4.node + 1);
    *(hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
      **)((long)iVar4.node[1].
                super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                .
                super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                .space.data_.align_ + 8) = iVar4.node + 1;
    this->m_settings =
         *(vanilla_chronicle_settings **)
          ((long)&((iVar4.node)->
                  super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                  ).
                  super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                  .space.data_ + 8);
    lVar2 = *(long *)((long)&((iVar4.node)->
                             super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                             ).
                             super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                             .space.data_ + 0x10);
    this->m_index_block_size_bits = (int)lVar2;
    this->m_lock = (mutex_t)(char)((ulong)lVar2 >> 0x20);
    *(int3 *)&this->field_0xd = (int3)((ulong)lVar2 >> 0x28);
    psVar6 = local_228;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
  }
  (psVar6->m_flag).super___atomic_flag_base._M_i = false;
  rVar9.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  rVar9.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (region_ptr)rVar9.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

region_ptr vanilla_index::index_for(std::int32_t cycle, std::int32_t file_number, bool append)
{
    std::lock_guard<mutex_t> lk(m_lock);
    auto key = std::make_pair(cycle, file_number);
    auto && creator = [this, append](const key_t & k)
    {
        auto cycle_ = std::get<0>(k);
        auto file_number_ = std::get<1>(k);
        auto && path = make_file(m_settings.path(),
                                 m_settings.cycle_format().date_from_cycle(cycle_),
                                 (util::streamer() << INDEX_FILE_NAME_PREFIX << file_number_).str(),
                                 append);
        return !path.empty()
                ? std::make_shared<region>(path, 1LL << m_index_block_size_bits, file_number_)
                : region_ptr();
    };

    return m_cache.get(key, creator);
}